

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteBook.cpp
# Opt level: O0

void __thiscall DeleteBook::operator()(DeleteBook *this)

{
  bool bVar1;
  unsigned_short uVar2;
  ostream *poVar3;
  ulong uVar4;
  char *pcVar5;
  void *this_00;
  Connection local_a0 [6];
  unsigned_short sign;
  string reply;
  string local_80 [32];
  string local_60 [48];
  string local_30 [8];
  string id;
  DeleteBook *this_local;
  
  bVar1 = Session::IsConnected((this->super_Event).m_Owner);
  if (bVar1) {
    Session::GetToken_abi_cxx11_((this->super_Event).m_Owner);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::string(local_30);
      std::operator<<((ostream *)&std::cout,"Id:");
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
      std::operator+((char *)local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "/api/v1/tema/library/books/");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      HttpRequest::SetRequest(&(this->super_Event).m_Request,"DELETE",pcVar5,"HTTP/1.1","");
      std::__cxx11::string::~string(local_60);
      HttpRequest::SetHost
                (&(this->super_Event).m_Request,
                 "ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
      HttpRequest::ClearHeaders(&(this->super_Event).m_Request);
      HttpRequest::AddHeader(&(this->super_Event).m_Request,"Connection","keep-alive");
      Session::GetToken_abi_cxx11_((this->super_Event).m_Owner);
      std::operator+((char *)local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Bearer ")
      ;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      HttpRequest::AddHeader(&(this->super_Event).m_Request,"Authorization",pcVar5);
      std::__cxx11::string::~string(local_80);
      HttpRequest::ClearCookies(&(this->super_Event).m_Request);
      Session::GetConnectSid_abi_cxx11_((this->super_Event).m_Owner);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      HttpRequest::AddCookie(&(this->super_Event).m_Request,"connect.sid",pcVar5);
      HttpRequest::SetData(&(this->super_Event).m_Request,"");
      Session::OpenConnection((this->super_Event).m_Owner);
      HttpRequest::Send(&(this->super_Event).m_Request,(this->super_Event).m_Owner);
      Connection::ReceiveHttps_abi_cxx11_(local_a0,(this->super_Event).m_Owner);
      Session::CloseConnection((this->super_Event).m_Owner);
      uVar2 = HttpReply::ExtractSign((string *)local_a0);
      if (uVar2 == 200) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Delete book successes");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Delete book failed ");
        poVar3 = std::operator<<(poVar3,"error ");
        this_00 = (void *)std::ostream::operator<<(poVar3,uVar2);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string(local_30);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "To proceed this command you need library access");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"You are not connected");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Please login to proceed this command");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void DeleteBook::operator()() {
    using namespace std;
    if (!m_Owner->IsConnected()) {
        cout << "You are not connected" << endl;
        cout << "Please login to proceed this command" << endl;
        return;
    }
    else if (m_Owner->GetToken().empty()) {
        cout << "To proceed this command you need library access" << endl;
        return;
    }
    string id;
    cout << "Id:"   ,   getline(cin, id);
    m_Request.SetRequest("DELETE", ("/api/v1/tema/library/books/" + id).c_str(), "HTTP/1.1");
    m_Request.SetHost("ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    m_Request.ClearHeaders();
    m_Request.AddHeader("Connection", "keep-alive");
    m_Request.AddHeader("Authorization", ("Bearer " + m_Owner->GetToken()).c_str());
    m_Request.ClearCookies();
    m_Request.AddCookie("connect.sid", m_Owner->GetConnectSid().c_str());
    m_Request.SetData("");
    m_Owner->OpenConnection();
    m_Request.Send(*m_Owner);
    std::string reply = Connection::ReceiveHttps(*m_Owner);
    m_Owner->CloseConnection();
    unsigned short sign = HttpReply::ExtractSign(reply);
    if (sign == 200) {
        cout << "Delete book successes" << std::endl;
    }
    else {
        cout << "Delete book failed " << "error " << sign << std::endl;
    }
}